

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     Combine<duckdb::FirstState<duckdb::string_t>,duckdb::FirstVectorFunction<false,false>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  idx_t iVar6;
  bool bVar7;
  
  if (count != 0) {
    pdVar1 = source->data;
    pdVar2 = target->data;
    iVar6 = 0;
    do {
      puVar3 = *(undefined8 **)(pdVar1 + iVar6 * 8);
      if ((*(char *)(puVar3 + 2) == '\x01') &&
         (puVar4 = *(undefined8 **)(pdVar2 + iVar6 * 8), *(char *)(puVar4 + 2) == '\0')) {
        bVar7 = *(char *)((long)puVar3 + 0x11) != '\0';
        if (!bVar7) {
          uVar5 = puVar3[1];
          *puVar4 = *puVar3;
          puVar4[1] = uVar5;
        }
        *(undefined1 *)(puVar4 + 2) = 1;
        *(bool *)((long)puVar4 + 0x11) = bVar7;
      }
      iVar6 = iVar6 + 1;
    } while (count != iVar6);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}